

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12.c
# Opt level: O0

int mbedtls_pkcs12_derivation
              (uchar *data,size_t datalen,uchar *pwd,size_t pwdlen,uchar *salt,size_t saltlen,
              mbedtls_md_type_t md_type,int id,int iterations)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uchar *fill_len;
  undefined1 *puVar4;
  uchar *local_2e0;
  undefined1 local_2d8 [8];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t i;
  size_t v;
  size_t use_len;
  size_t hlen;
  uchar *puStack_290;
  uchar c;
  uchar *p;
  uchar hash_output [64];
  uchar hash_block [128];
  uchar pwd_block [128];
  uchar salt_block [128];
  uchar diversifier [128];
  uint j;
  int ret;
  size_t saltlen_local;
  uchar *salt_local;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t datalen_local;
  uchar *data_local;
  
  if (((datalen < 0x81) && (pwdlen < 0x41)) && (saltlen < 0x41)) {
    md_ctx.hmac_ctx = mbedtls_md_info_from_type(md_type);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      data_local._4_4_ = -0x1f00;
    }
    else {
      mbedtls_md_init((mbedtls_md_context_t *)local_2d8);
      data_local._4_4_ =
           mbedtls_md_setup((mbedtls_md_context_t *)local_2d8,(mbedtls_md_info_t *)md_ctx.hmac_ctx,0
                           );
      if (data_local._4_4_ == 0) {
        bVar2 = mbedtls_md_get_size((mbedtls_md_info_t *)md_ctx.hmac_ctx);
        fill_len = (uchar *)(ulong)bVar2;
        if (fill_len < (uchar *)0x21) {
          i = 0x40;
        }
        else {
          i = 0x80;
        }
        memset(salt_block + 0x78,id & 0xff,i);
        pkcs12_fill_buffer(pwd_block + 0x78,i,salt,saltlen);
        pkcs12_fill_buffer(hash_block + 0x78,i,pwd,pwdlen);
        puStack_290 = data;
        pwd_local = (uchar *)datalen;
        while (pwd_local != (uchar *)0x0) {
          diversifier._124_4_ = mbedtls_md_starts((mbedtls_md_context_t *)local_2d8);
          if (((diversifier._124_4_ != 0) ||
              (diversifier._124_4_ =
                    mbedtls_md_update((mbedtls_md_context_t *)local_2d8,salt_block + 0x78,i),
              diversifier._124_4_ != 0)) ||
             ((diversifier._124_4_ =
                    mbedtls_md_update((mbedtls_md_context_t *)local_2d8,pwd_block + 0x78,i),
              diversifier._124_4_ != 0 ||
              ((diversifier._124_4_ =
                     mbedtls_md_update((mbedtls_md_context_t *)local_2d8,hash_block + 0x78,i),
               diversifier._124_4_ != 0 ||
               (diversifier._124_4_ =
                     mbedtls_md_finish((mbedtls_md_context_t *)local_2d8,(uchar *)&p),
               diversifier._124_4_ != 0)))))) goto LAB_0026d627;
          for (md_info = (mbedtls_md_info_t *)0x1; md_info < (mbedtls_md_info_t *)(long)iterations;
              md_info = (mbedtls_md_info_t *)((long)&md_info->type + 1)) {
            diversifier._124_4_ =
                 mbedtls_md((mbedtls_md_info_t *)md_ctx.hmac_ctx,(uchar *)&p,(size_t)fill_len,
                            (uchar *)&p);
            if (diversifier._124_4_ != 0) goto LAB_0026d627;
          }
          local_2e0 = fill_len;
          if (pwd_local <= fill_len) {
            local_2e0 = pwd_local;
          }
          memcpy(puStack_290,&p,(size_t)local_2e0);
          pwd_local = pwd_local + -(long)local_2e0;
          puStack_290 = local_2e0 + (long)puStack_290;
          if (pwd_local == (uchar *)0x0) break;
          pkcs12_fill_buffer(hash_output + 0x38,i,(uchar *)&p,(size_t)fill_len);
          md_info = (mbedtls_md_info_t *)i;
          while ((md_info != (mbedtls_md_info_t *)0x0 &&
                 (puVar4 = (undefined1 *)((long)&md_info[-1].process_func + 7),
                 uVar1 = (hash_output + 0x38)[(long)puVar4],
                 (hash_output + 0x38)[(long)puVar4] = uVar1 + '\x01',
                 (uchar)(uVar1 + '\x01') == '\0'))) {
            md_info = (mbedtls_md_info_t *)((long)&md_info[-1].process_func + 7);
          }
          hlen._7_1_ = 0;
          for (md_info = (mbedtls_md_info_t *)i; md_info != (mbedtls_md_info_t *)0x0;
              md_info = (mbedtls_md_info_t *)((long)&md_info[-1].process_func + 7)) {
            iVar3 = (uint)(byte)((undefined1 *)((long)&md_info[-4].block_size + 3))
                                [(long)register0x00000020] +
                    (uint)(byte)((undefined1 *)((long)&md_info[-7].starts_func + 7))
                                [(long)register0x00000020] + (uint)hlen._7_1_;
            hlen._7_1_ = (byte)((uint)iVar3 >> 8);
            ((undefined1 *)((long)&md_info[-4].block_size + 3))[(long)register0x00000020] =
                 (char)iVar3;
          }
          hlen._7_1_ = 0;
          for (md_info = (mbedtls_md_info_t *)i; md_info != (mbedtls_md_info_t *)0x0;
              md_info = (mbedtls_md_info_t *)((long)&md_info[-1].process_func + 7)) {
            iVar3 = (uint)(byte)((undefined1 *)((long)&md_info[-6].ctx_free_func + 7))
                                [(long)register0x00000020] +
                    (uint)(byte)((undefined1 *)((long)&md_info[-7].starts_func + 7))
                                [(long)register0x00000020] + (uint)hlen._7_1_;
            hlen._7_1_ = (byte)((uint)iVar3 >> 8);
            ((undefined1 *)((long)&md_info[-6].ctx_free_func + 7))[(long)register0x00000020] =
                 (char)iVar3;
          }
        }
        diversifier[0x7c] = '\0';
        diversifier[0x7d] = '\0';
        diversifier[0x7e] = '\0';
        diversifier[0x7f] = '\0';
LAB_0026d627:
        mbedtls_zeroize(pwd_block + 0x78,0x80);
        mbedtls_zeroize(hash_block + 0x78,0x80);
        mbedtls_zeroize(hash_output + 0x38,0x80);
        mbedtls_zeroize(&p,0x40);
        mbedtls_md_free((mbedtls_md_context_t *)local_2d8);
        data_local._4_1_ = diversifier[0x7c];
        data_local._5_1_ = diversifier[0x7d];
        data_local._6_1_ = diversifier[0x7e];
        data_local._7_1_ = diversifier[0x7f];
      }
    }
  }
  else {
    data_local._4_4_ = -0x1f80;
  }
  return data_local._4_4_;
}

Assistant:

int mbedtls_pkcs12_derivation( unsigned char *data, size_t datalen,
                       const unsigned char *pwd, size_t pwdlen,
                       const unsigned char *salt, size_t saltlen,
                       mbedtls_md_type_t md_type, int id, int iterations )
{
    int ret;
    unsigned int j;

    unsigned char diversifier[128];
    unsigned char salt_block[128], pwd_block[128], hash_block[128];
    unsigned char hash_output[MBEDTLS_MD_MAX_SIZE];
    unsigned char *p;
    unsigned char c;

    size_t hlen, use_len, v, i;

    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    // This version only allows max of 64 bytes of password or salt
    if( datalen > 128 || pwdlen > 64 || saltlen > 64 )
        return( MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA );

    md_info = mbedtls_md_info_from_type( md_type );
    if( md_info == NULL )
        return( MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE );

    mbedtls_md_init( &md_ctx );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        return( ret );
    hlen = mbedtls_md_get_size( md_info );

    if( hlen <= 32 )
        v = 64;
    else
        v = 128;

    memset( diversifier, (unsigned char) id, v );

    pkcs12_fill_buffer( salt_block, v, salt, saltlen );
    pkcs12_fill_buffer( pwd_block,  v, pwd,  pwdlen  );

    p = data;
    while( datalen > 0 )
    {
        // Calculate hash( diversifier || salt_block || pwd_block )
        if( ( ret = mbedtls_md_starts( &md_ctx ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, diversifier, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, salt_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_update( &md_ctx, pwd_block, v ) ) != 0 )
            goto exit;

        if( ( ret = mbedtls_md_finish( &md_ctx, hash_output ) ) != 0 )
            goto exit;

        // Perform remaining ( iterations - 1 ) recursive hash calculations
        for( i = 1; i < (size_t) iterations; i++ )
        {
            if( ( ret = mbedtls_md( md_info, hash_output, hlen, hash_output ) ) != 0 )
                goto exit;
        }

        use_len = ( datalen > hlen ) ? hlen : datalen;
        memcpy( p, hash_output, use_len );
        datalen -= use_len;
        p += use_len;

        if( datalen == 0 )
            break;

        // Concatenating copies of hash_output into hash_block (B)
        pkcs12_fill_buffer( hash_block, v, hash_output, hlen );

        // B += 1
        for( i = v; i > 0; i-- )
            if( ++hash_block[i - 1] != 0 )
                break;

        // salt_block += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = salt_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            salt_block[i - 1] = j & 0xFF;
        }

        // pwd_block  += B
        c = 0;
        for( i = v; i > 0; i-- )
        {
            j = pwd_block[i - 1] + hash_block[i - 1] + c;
            c = (unsigned char) (j >> 8);
            pwd_block[i - 1] = j & 0xFF;
        }
    }

    ret = 0;

exit:
    mbedtls_zeroize( salt_block, sizeof( salt_block ) );
    mbedtls_zeroize( pwd_block, sizeof( pwd_block ) );
    mbedtls_zeroize( hash_block, sizeof( hash_block ) );
    mbedtls_zeroize( hash_output, sizeof( hash_output ) );

    mbedtls_md_free( &md_ctx );

    return( ret );
}